

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_rwkv_wkv6::build_graph(test_rwkv_wkv6 *this,ggml_context *ctx)

{
  initializer_list<long> __l;
  initializer_list<long> __l_00;
  initializer_list<long> __l_01;
  initializer_list<long> __l_02;
  initializer_list<long> __l_03;
  initializer_list<long> __l_04;
  ggml_tensor *pgVar1;
  vector<long,_std::allocator<long>_> *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  ggml_tensor *s;
  ggml_tensor *td;
  ggml_tensor *tf;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *r;
  int64_t n_tokens;
  int64_t *in_stack_fffffffffffffd38;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffd40;
  vector<long,_std::allocator<long>_> *this_00;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 uVar2;
  test_case *in_stack_fffffffffffffd50;
  test_case *this_01;
  allocator_type *in_stack_fffffffffffffd58;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffd60;
  vector<long,_std::allocator<long>_> *this_02;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 uVar3;
  size_type in_stack_fffffffffffffd70;
  undefined1 *puVar4;
  test_case local_1f1;
  ggml_tensor *local_1b8;
  undefined1 local_1a9;
  undefined8 local_1a8;
  undefined8 local_1a0;
  long local_198;
  undefined8 *local_190;
  undefined8 local_188;
  ggml_tensor *local_168;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 *local_148;
  undefined8 local_140;
  ggml_tensor *local_120;
  undefined8 local_110;
  undefined8 local_108;
  long local_100;
  undefined8 *local_f8;
  undefined8 local_f0;
  ggml_tensor *local_d0;
  undefined8 local_c0;
  undefined8 local_b8;
  long local_b0;
  undefined8 *local_a8;
  undefined8 local_a0;
  ggml_tensor *local_80;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  undefined8 *local_48;
  undefined8 local_40;
  ggml_tensor *local_20;
  long local_18;
  vector<long,_std::allocator<long>_> *local_10;
  
  local_50 = *(long *)(in_RDI + 0x50) * *(long *)(in_RDI + 0x58);
  local_60 = *(undefined8 *)(in_RDI + 0x48);
  local_58 = *(undefined8 *)(in_RDI + 0x40);
  local_48 = &local_60;
  local_40 = 3;
  local_18 = local_50;
  local_10 = in_RSI;
  std::allocator<long>::allocator((allocator<long> *)0x197b7e);
  __l._M_array._4_4_ = in_stack_fffffffffffffd6c;
  __l._M_array._0_4_ = in_stack_fffffffffffffd68;
  __l._M_len = in_stack_fffffffffffffd70;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffd60,__l,in_stack_fffffffffffffd58);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x197bb2);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd50,
                      (ggml_context *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                      (ggml_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                      (int)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<long>::~allocator((allocator<long> *)0x197bfa);
  local_c0 = *(undefined8 *)(in_RDI + 0x48);
  local_b8 = *(undefined8 *)(in_RDI + 0x40);
  local_b0 = local_18;
  local_a8 = &local_c0;
  local_a0 = 3;
  local_20 = pgVar1;
  std::allocator<long>::allocator((allocator<long> *)0x197c85);
  __l_00._M_array._4_4_ = in_stack_fffffffffffffd6c;
  __l_00._M_array._0_4_ = in_stack_fffffffffffffd68;
  __l_00._M_len = in_stack_fffffffffffffd70;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffd60,__l_00,in_stack_fffffffffffffd58);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x197cb9);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd50,
                      (ggml_context *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                      (ggml_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                      (int)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<long>::~allocator((allocator<long> *)0x197d01);
  local_110 = *(undefined8 *)(in_RDI + 0x48);
  local_108 = *(undefined8 *)(in_RDI + 0x40);
  local_100 = local_18;
  local_f8 = &local_110;
  local_f0 = 3;
  local_80 = pgVar1;
  std::allocator<long>::allocator((allocator<long> *)0x197d89);
  __l_01._M_array._4_4_ = in_stack_fffffffffffffd6c;
  __l_01._M_array._0_4_ = in_stack_fffffffffffffd68;
  __l_01._M_len = in_stack_fffffffffffffd70;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffd60,__l_01,in_stack_fffffffffffffd58);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x197dbd);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd50,
                      (ggml_context *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                      (ggml_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                      (int)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<long>::~allocator((allocator<long> *)0x197dff);
  local_158 = *(undefined8 *)(in_RDI + 0x48);
  local_150 = *(undefined8 *)(in_RDI + 0x40);
  local_148 = &local_158;
  local_140 = 2;
  local_d0 = pgVar1;
  std::allocator<long>::allocator((allocator<long> *)0x197e6e);
  __l_02._M_array._4_4_ = in_stack_fffffffffffffd6c;
  __l_02._M_array._0_4_ = in_stack_fffffffffffffd68;
  __l_02._M_len = in_stack_fffffffffffffd70;
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffd60,__l_02,in_stack_fffffffffffffd58);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x197e9f);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd50,
                      (ggml_context *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                      (ggml_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                      (int)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<long>::~allocator((allocator<long> *)0x197ede);
  uVar3 = *(undefined4 *)(in_RDI + 0x38);
  local_1a8 = *(undefined8 *)(in_RDI + 0x48);
  local_1a0 = *(undefined8 *)(in_RDI + 0x40);
  local_198 = local_18;
  local_190 = &local_1a8;
  local_188 = 3;
  puVar4 = &local_1a9;
  this_02 = local_10;
  local_120 = pgVar1;
  std::allocator<long>::allocator((allocator<long> *)0x197f5d);
  __l_03._M_array._4_4_ = uVar3;
  __l_03._M_array._0_4_ = in_stack_fffffffffffffd68;
  __l_03._M_len = (size_type)puVar4;
  std::vector<long,_std::allocator<long>_>::vector(this_02,__l_03,in_stack_fffffffffffffd58);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x197f8e);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_fffffffffffffd50,
                      (ggml_context *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                      (ggml_type)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                      (int)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffd40);
  std::allocator<long>::~allocator((allocator<long> *)0x197fcd);
  uVar2 = *(undefined4 *)(in_RDI + 0x38);
  local_1f1._1_8_ = *(long *)(in_RDI + 0x48) * *(long *)(in_RDI + 0x48) * *(long *)(in_RDI + 0x40);
  local_1f1._9_8_ = *(undefined8 *)(in_RDI + 0x58);
  local_1f1._17_8_ = (long)&local_1f1._vptr_test_case + 1;
  local_1f1._25_8_ = 2;
  this_01 = &local_1f1;
  this_00 = local_10;
  local_168 = pgVar1;
  std::allocator<long>::allocator((allocator<long> *)0x198048);
  __l_04._M_array._4_4_ = uVar3;
  __l_04._M_array._0_4_ = in_stack_fffffffffffffd68;
  __l_04._M_len = (size_type)puVar4;
  std::vector<long,_std::allocator<long>_>::vector(this_02,__l_04,(allocator_type *)pgVar1);
  std::vector<long,_std::allocator<long>_>::data((vector<long,_std::allocator<long>_> *)0x198079);
  pgVar1 = test_case::ggml_new_tensor
                     (this_01,(ggml_context *)CONCAT44(uVar2,in_stack_fffffffffffffd48),
                      (ggml_type)((ulong)this_00 >> 0x20),(int)this_00,in_stack_fffffffffffffd38);
  std::vector<long,_std::allocator<long>_>::~vector(this_00);
  std::allocator<long>::~allocator((allocator<long> *)0x1980b8);
  local_1b8 = pgVar1;
  pgVar1 = (ggml_tensor *)
           ggml_rwkv_wkv6(local_10,local_80,local_d0,local_20,local_120,local_168,pgVar1);
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        const int64_t n_tokens = n_seq_tokens * n_seqs;
        ggml_tensor * r   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * k   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * v   = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * tf  = ggml_new_tensor(ctx, type, 2, std::vector<int64_t>{ head_size, head_count }.data());
        ggml_tensor * td  = ggml_new_tensor(ctx, type, 3, std::vector<int64_t>{ head_size, head_count, n_tokens }.data());
        ggml_tensor * s   = ggml_new_tensor(ctx, type, 2, std::vector<int64_t>{ head_size * head_size * head_count, n_seqs }.data());
        ggml_tensor * out = ggml_rwkv_wkv6(ctx, k, v, r, tf, td, s);
        return out;
    }